

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringStream.hpp
# Opt level: O3

StringStream<char> * __thiscall
Qentem::StringStream<char>::operator=(StringStream<char> *this,char *str)

{
  long lVar1;
  ulong uVar2;
  long lVar3;
  
  this->length_ = 0;
  if ((str == (char *)0x0) || (*str == '\0')) {
    lVar3 = 0;
  }
  else {
    lVar3 = 0;
    do {
      lVar1 = lVar3 + 1;
      lVar3 = lVar3 + 1;
    } while (str[lVar1] != '\0');
    if (this->capacity_ < (uint)lVar3) {
      expand(this,(uint)lVar3);
      uVar2 = (ulong)this->length_;
      goto LAB_00104869;
    }
  }
  uVar2 = 0;
LAB_00104869:
  Memory::Copy<unsigned_int>(this->storage_ + uVar2,str,(uint)lVar3);
  this->length_ = (uint)lVar3;
  return this;
}

Assistant:

StringStream &operator=(const Char_T *str) {
        Clear();
        write(str, StringUtils::Count(str));

        return *this;
    }